

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_writer.cpp
# Opt level: O0

void __thiscall
charls::jpeg_stream_writer::write_spiff_end_of_directory_entry(jpeg_stream_writer *this)

{
  size_type sVar1;
  const_pointer data;
  jpeg_stream_writer *this_local;
  
  sVar1 = std::array<unsigned_char,_6UL>::size
                    (&write_spiff_end_of_directory_entry::spiff_end_of_directory);
  write_segment_header(this,application_data8,sVar1);
  data = std::array<unsigned_char,_6UL>::data
                   (&write_spiff_end_of_directory_entry::spiff_end_of_directory);
  sVar1 = std::array<unsigned_char,_6UL>::size
                    (&write_spiff_end_of_directory_entry::spiff_end_of_directory);
  write_bytes(this,data,sVar1);
  return;
}

Assistant:

void jpeg_stream_writer::write_spiff_end_of_directory_entry()
{
    // Note: ISO/IEC 10918-3, Annex F.2.2.3 documents that the EOD entry segment should have a length of 8
    // but only 6 data bytes. This approach allows to wrap existing bit streams\encoders with a SPIFF header.
    // In this implementation the SOI marker is added as data bytes to simplify the design.
    static constexpr array<uint8_t, 6> spiff_end_of_directory{
        {0, 0, 0, spiff_end_of_directory_entry_type, 0xFF, to_underlying_type(charls::jpeg_marker_code::start_of_image)}};

    write_segment_header(jpeg_marker_code::application_data8, spiff_end_of_directory.size());
    write_bytes(spiff_end_of_directory.data(), spiff_end_of_directory.size());
}